

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::SetNeighbourInfo
          (TPZGeoBlend<pzgeom::TPZGeoPrism> *this,int side,TPZGeoElSide *neigh,
          TPZTransform<double> *trans)

{
  long lVar1;
  TPZGeoElSideIndex local_40;
  
  lVar1 = (long)(side + -6);
  if (this->fNeighbours[lVar1].fGeoElIndex == -1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(&local_40,neigh);
    this->fNeighbours[lVar1].fGeoElIndex = local_40.fGeoElIndex;
    this->fNeighbours[lVar1].fSide = local_40.fSide;
    TPZTransform<double>::operator=
              ((TPZTransform<double> *)(&this->field_0x1c0 + lVar1 * 0x1a0),trans);
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::SetNeighbourInfo(int side, TPZGeoElSide &neigh, TPZTransform<> &trans)
{
	if(!(fNeighbours[side-TGeo::NNodes].ElementIndex() != -1))
	{
		fNeighbours[side-TGeo::NNodes] = neigh;
		fTrans[side - TGeo::NNodes] = trans;
	}
	else
	{
#ifdef PZ_LOG
        if(logger.isWarnEnabled())
        {
        
            std::stringstream mess;
            mess << "Trying to SetNeighbourInfo for an already set element\n";
            mess << "* this * = " << __PRETTY_FUNCTION__ << "\n";
            this->Print(mess);
            mess << "* neigh * = \n";
            neigh.Element()->Print(mess);
            LOGPZ_WARN(logger,mess.str());
        }
#endif
	}
}